

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll.cpp
# Opt level: O0

void __thiscall sysapi::epoll_registration::swap(epoll_registration *this,epoll_registration *other)

{
  epoll_registration *other_local;
  epoll_registration *this_local;
  
  std::swap<sysapi::epoll*>(&this->ep,&other->ep);
  std::swap<int>(&this->fd,&other->fd);
  std::swap<unsigned_int>(&this->events,&other->events);
  std::swap<void,unsigned_int>(&this->callback,&other->callback);
  update(this);
  update(other);
  return;
}

Assistant:

void epoll_registration::swap(epoll_registration& other)
{
    std::swap(ep,       other.ep);
    std::swap(fd,       other.fd);
    std::swap(events,   other.events);
    std::swap(callback, other.callback);
    update();
    other.update();
}